

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::SetDefaultInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *args_2)

{
  SetDefaultInfo *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_b8;
  string local_b0;
  AlterEntryData local_90;
  
  this_00 = (SetDefaultInfo *)operator_new(0xa0);
  AlterEntryData::AlterEntryData(&local_90,args);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)args_1);
  local_b8._M_head_impl =
       (args_2->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (args_2->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  SetDefaultInfo::SetDefaultInfo
            (this_00,&local_90,&local_b0,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_b8);
  *(SetDefaultInfo **)this = this_00;
  if (local_b8._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_b8._M_head_impl = (ParsedExpression *)0x0;
  ::std::__cxx11::string::~string((string *)&local_b0);
  AlterEntryData::~AlterEntryData(&local_90);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}